

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O1

tuple<long,_double,_double> * __thiscall
fasttext::FastText::progressInfo
          (tuple<long,_double,_double> *__return_storage_ptr__,FastText *this,real progress)

{
  double dVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  time_point local_20;
  
  local_20.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  dVar3 = utils::getDuration(&this->start_,&local_20);
  dVar1 = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->lr;
  lVar2 = 0;
  dVar4 = 2592000.0;
  if ((0.0 < progress) && (0.0 <= dVar3)) {
    dVar4 = (double)(long)((dVar3 * (double)(1.0 - progress)) / (double)progress);
    lVar2 = (long)(((double)(this->tokenCount_).super___atomic_base<long>._M_i / dVar3) /
                  (double)((this->args_).
                           super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          thread);
  }
  (__return_storage_ptr__->super__Tuple_impl<0UL,_long,_double,_double>).
  super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
  super__Head_base<2UL,_double,_false>._M_head_impl = dVar4;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_long,_double,_double>).
  super__Tuple_impl<1UL,_double,_double>.super__Head_base<1UL,_double,_false>._M_head_impl =
       (1.0 - (double)progress) * dVar1;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_long,_double,_double>).
  super__Head_base<0UL,_long,_false>._M_head_impl = lVar2;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<int64_t, double, double> FastText::progressInfo(real progress) {
  double t = utils::getDuration(start_, std::chrono::steady_clock::now());
  double lr = args_->lr * (1.0 - progress);
  double wst = 0;

  int64_t eta = 2592000; // Default to one month in seconds (720 * 3600)

  if (progress > 0 && t >= 0) {
    eta = t * (1 - progress) / progress;
    wst = double(tokenCount_) / t / args_->thread;
  }

  return std::tuple<double, double, int64_t>(wst, lr, eta);
}